

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::StrictMock<MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::StrictMock
          (StrictMock<MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_> *this)

{
  MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this_00;
  
  this_00 = &this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this_00);
  (this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).gmock2_Write_1248.
  super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
  .current_spec_.function_mocker_ =
       (FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
        *)this_00;
  ((linked_ptr<const_testing::MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
    *)((long)&(this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
              gmock2_Write_1248.
              super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
              .current_spec_.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
      + 8))->value_ =
       (MatcherInterface<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>
        *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
          gmock2_Write_1248.
          super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
               gmock2_Write_1248.
               super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
       + 0x10);
  (this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).gmock2_Write_1248.
  super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
  .current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  .
  super__Head_base<1UL,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028ebc8;
  ((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
  ((long)&(this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
          gmock2_Write_1248.
          super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
          .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false> + 8))->value_
       = (MatcherInterface<fmt::BasicStringRef<char>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
          gmock2_Write_1248.
          super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
          .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false> + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
                  gmock2_Write_1248.
                  super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
                  .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false> + 0x10
          );
  (this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).gmock2_Write_1248.
  super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
  .current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&>_>
  .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028bae0;
  (this->super_MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>).gmock2_Write_1248.
  super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_const_mp::SolutionAdapter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_&)>
  .super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028feb0;
  this->_vptr_StrictMock = (_func_int **)&PTR__StrictMock_0028eb10;
  Mock::FailUninterestingCalls(this_00);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }